

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_glsl_op
          (CompilerMSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  bool bVar1;
  uint32_t uVar2;
  BaseType input_type;
  BaseType BVar3;
  SPIRExpression *pSVar4;
  mapped_type *pmVar5;
  SPIRType *pSVar6;
  char *pcVar7;
  uint32_t uVar8;
  char (*ts_2) [3];
  uint32_t op2;
  uint32_t uStackY_b0;
  char (*in_stack_ffffffffffffff58) [2];
  uint32_t id_local;
  string expr;
  string local_70;
  string local_50;
  
  ts_2 = (char (*) [3])args;
  id_local = id;
  uVar2 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  input_type = to_signed_basetype(uVar2);
  BVar3 = to_unsigned_basetype(uVar2);
  switch(eop) {
  case 2:
    uVar2 = *args;
    pcVar7 = "rint";
    break;
  default:
    goto switchD_002a14e7_caseD_3;
  case 0x19:
    uVar2 = *args;
    uVar8 = args[1];
    pcVar7 = "atan2";
    goto LAB_002a19de;
  case 0x20:
    uVar2 = *args;
    pcVar7 = "rsqrt";
    break;
  case 0x22:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar2 = pSVar6->columns;
    if (uVar2 == 4) {
      uVar2 = *args;
      pcVar7 = "spvInverse4x4";
    }
    else if (uVar2 == 3) {
      uVar2 = *args;
      pcVar7 = "spvInverse3x3";
    }
    else {
      if (uVar2 != 2) {
        return;
      }
      uVar2 = *args;
      pcVar7 = "spvInverse2x2";
    }
    break;
  case 0x23:
  case 0x33:
    pSVar4 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,args[1]);
    if ((pSVar4 != (SPIRExpression *)0x0) && (pSVar4->access_chain == true)) {
      pSVar6 = Compiler::expression_type((Compiler *)this,args[1]);
      bVar1 = Compiler::is_scalar((Compiler *)this,pSVar6);
      if (bVar1) {
        CompilerGLSL::register_call_out_argument(&this->super_CompilerGLSL,args[1]);
        ::std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&(this->super_CompilerGLSL).super_Compiler.forced_temporaries,&id_local);
        pmVar5 = ::std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&(this->super_CompilerGLSL).extra_sub_expressions,&id_local);
        if (*pmVar5 == 0) {
          uVar2 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
          *pmVar5 = uVar2;
        }
        uVar2 = Compiler::get_pointee_type_id((Compiler *)this,(pSVar4->expression_type).id);
        CompilerGLSL::emit_uninitialized_temporary_expression
                  (&this->super_CompilerGLSL,uVar2,*pmVar5);
        pcVar7 = "frexp";
        if (eop == 0x23) {
          pcVar7 = "modf";
        }
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,result_type,id_local,*args,*pmVar5,pcVar7);
        CompilerGLSL::to_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,args[1],true);
        CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,*pmVar5,true);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&expr,(char (*) [4])0x31e8c7,&local_70,
                   (char (*) [2])0x304bae);
        ::std::__cxx11::string::~string((string *)&local_70);
        goto LAB_002a1a66;
      }
    }
    goto switchD_002a14e7_caseD_3;
  case 0x25:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar2 = *args;
    uVar8 = args[1];
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      pcVar7 = "fast::min";
      goto LAB_002a19de;
    }
    goto LAB_002a1987;
  case 0x28:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar2 = *args;
    uVar8 = args[1];
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      pcVar7 = "fast::max";
      goto LAB_002a19de;
    }
    goto LAB_002a19d2;
  case 0x2b:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar2 = *args;
    uVar8 = args[1];
    op2 = args[2];
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      pcVar7 = "fast::clamp";
      goto LAB_002a1b33;
    }
    goto LAB_002a1b2c;
  case 0x36:
    uVar2 = *args;
    pcVar7 = "pack_float_to_snorm4x8";
    break;
  case 0x37:
    uVar2 = *args;
    pcVar7 = "pack_float_to_unorm4x8";
    break;
  case 0x38:
    uVar2 = *args;
    pcVar7 = "pack_float_to_snorm2x16";
    break;
  case 0x39:
    uVar2 = *args;
    pcVar7 = "pack_float_to_unorm2x16";
    break;
  case 0x3a:
    CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[3]>
              (&expr,(spirv_cross *)"as_type<uint>(half2(",(char (*) [21])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31a9b3,ts_2);
    ::std::__cxx11::string::~string((string *)&local_70);
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&expr,bVar1,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
    goto LAB_002a1a66;
  case 0x3b:
    uVar2 = *args;
    pcVar7 = "unsupported_GLSLstd450PackDouble2x32";
    break;
  case 0x3c:
    uVar2 = *args;
    pcVar7 = "unpack_snorm2x16_to_float";
    break;
  case 0x3d:
    uVar2 = *args;
    pcVar7 = "unpack_unorm2x16_to_float";
    break;
  case 0x3e:
    CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[23],std::__cxx11::string,char_const(&)[3]>
              (&expr,(spirv_cross *)"float2(as_type<half2>(",(char (*) [23])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31a9b3,ts_2);
    ::std::__cxx11::string::~string((string *)&local_70);
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&expr,bVar1,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
LAB_002a1a66:
    ::std::__cxx11::string::~string((string *)&expr);
    return;
  case 0x3f:
    uVar2 = *args;
    pcVar7 = "unpack_snorm4x8_to_float";
    break;
  case 0x40:
    uVar2 = *args;
    pcVar7 = "unpack_unorm4x8_to_float";
    break;
  case 0x41:
    uVar2 = *args;
    pcVar7 = "unsupported_GLSLstd450UnpackDouble2x32";
    break;
  case 0x42:
    pSVar6 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar6->vecsize != 1) {
      uStackY_b0 = 0x42;
      eop = uStackY_b0;
      goto LAB_002a1b7c;
    }
    uVar2 = *args;
    pcVar7 = "abs";
    break;
  case 0x43:
    pSVar6 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar6->vecsize == 1) {
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,*args,true);
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_50,&this->super_CompilerGLSL,args[1],true);
      join<char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&expr,(spirv_cross *)"abs(",(char (*) [5])&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31ede6,
                 (char (*) [4])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,
                 in_stack_ffffffffffffff58);
      bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      if (bVar1) {
        bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
      }
      else {
        bVar1 = false;
      }
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&expr,bVar1,false);
      ::std::__cxx11::string::~string((string *)&expr);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
      Compiler::inherit_expression_dependencies((Compiler *)this,id,args[1]);
      return;
    }
    uStackY_b0 = 0x43;
    eop = uStackY_b0;
    goto LAB_002a1b7c;
  case 0x45:
    pSVar6 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar6->vecsize != 1) {
      uStackY_b0 = 0x45;
      eop = uStackY_b0;
      goto LAB_002a1b7c;
    }
    uVar2 = *args;
    pcVar7 = "sign";
    break;
  case 0x46:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    if (pSVar6->vecsize == 1) {
      uVar2 = *args;
      uVar8 = args[1];
      op2 = args[2];
      pcVar7 = "spvFaceForward";
      goto LAB_002a1b33;
    }
    uStackY_b0 = 0x46;
    eop = uStackY_b0;
    goto LAB_002a1b7c;
  case 0x47:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    if (pSVar6->vecsize == 1) {
      uVar2 = *args;
      uVar8 = args[1];
      pcVar7 = "spvReflect";
      goto LAB_002a19de;
    }
    uStackY_b0 = 0x47;
    eop = uStackY_b0;
    goto LAB_002a1b7c;
  case 0x48:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    if (pSVar6->vecsize == 1) {
      uVar2 = *args;
      uVar8 = args[1];
      op2 = args[2];
      pcVar7 = "spvRefract";
      goto LAB_002a1b33;
    }
    uStackY_b0 = 0x48;
    eop = uStackY_b0;
LAB_002a1b7c:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    return;
  case 0x49:
    pSVar6 = Compiler::expression_type((Compiler *)this,*args);
    input_type = *(BaseType *)&(pSVar6->super_IVariant).field_0xc;
    uVar2 = *args;
    pcVar7 = "spvFindLSB";
    goto LAB_002a1ad1;
  case 0x4a:
    uVar2 = *args;
    pcVar7 = "spvFindSMSB";
    goto LAB_002a1ad1;
  case 0x4b:
    uVar2 = *args;
    pcVar7 = "spvFindUMSB";
    input_type = BVar3;
LAB_002a1ad1:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,result_type,id,uVar2,pcVar7,input_type,input_type);
    return;
  case 0x4f:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar2 = *args;
    uVar8 = args[1];
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      pcVar7 = "precise::min";
      goto LAB_002a19de;
    }
LAB_002a1987:
    pcVar7 = "min";
LAB_002a19de:
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,result_type,id,uVar2,uVar8,pcVar7);
    return;
  case 0x50:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar2 = *args;
    uVar8 = args[1];
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      pcVar7 = "precise::max";
      goto LAB_002a19de;
    }
LAB_002a19d2:
    pcVar7 = "max";
    goto LAB_002a19de;
  case 0x51:
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    uVar2 = *args;
    uVar8 = args[1];
    op2 = args[2];
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xd) {
      pcVar7 = "precise::clamp";
      goto LAB_002a1b33;
    }
LAB_002a1b2c:
    pcVar7 = "clamp";
LAB_002a1b33:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,result_type,id,uVar2,uVar8,op2,pcVar7);
    return;
  }
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,uVar2,pcVar7);
  return;
switchD_002a14e7_caseD_3:
  goto LAB_002a1b7c;
}

Assistant:

void CompilerMSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "atan2");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;
	case GLSLstd450RoundEven:
		emit_unary_func_op(result_type, id, args[0], "rint");
		break;

	case GLSLstd450FindILsb:
	{
		// In this template version of findLSB, we return T.
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindLSB", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindSMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindUMSB", uint_type, uint_type);
		break;

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm2x16");
		break;

	case GLSLstd450PackHalf2x16:
	{
		auto expr = join("as_type<uint>(half2(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm4x8_to_float");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm4x8_to_float");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm2x16_to_float");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm2x16_to_float");
		break;

	case GLSLstd450UnpackHalf2x16:
	{
		auto expr = join("float2(as_type<half2>(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450PackDouble2x32"); // Currently unsupported
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450UnpackDouble2x32"); // Currently unsupported
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &mat_type = get<SPIRType>(result_type);
		switch (mat_type.columns)
		{
		case 2:
			emit_unary_func_op(result_type, id, args[0], "spvInverse2x2");
			break;
		case 3:
			emit_unary_func_op(result_type, id, args[0], "spvInverse3x3");
			break;
		case 4:
			emit_unary_func_op(result_type, id, args[0], "spvInverse4x4");
			break;
		default:
			break;
		}
		break;
	}

	case GLSLstd450FMin:
		// If the result type isn't float, don't bother calling the specific
		// precise::/fast:: version. Metal doesn't have those for half and
		// double types.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::min");
		break;

	case GLSLstd450FMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::max");
		break;

	case GLSLstd450FClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fast::clamp");
		break;

	case GLSLstd450NMin:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::min");
		break;

	case GLSLstd450NMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::max");
		break;

	case GLSLstd450NClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "precise::clamp");
		break;

		// TODO:
		//        GLSLstd450InterpolateAtCentroid (centroid_no_perspective qualifier)
		//        GLSLstd450InterpolateAtSample (sample_no_perspective qualifier)
		//        GLSLstd450InterpolateAtOffset

	case GLSLstd450Distance:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to length(a - b) -> abs(a - b).
			emit_op(result_type, id,
			        join("abs(", to_enclosed_unpacked_expression(args[0]), " - ",
			             to_enclosed_unpacked_expression(args[1]), ")"),
			        should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Length:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to abs().
			emit_unary_func_op(result_type, id, args[0], "abs");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Normalize:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Returns -1 or 1 for valid input, sign() does the job.
			emit_unary_func_op(result_type, id, args[0], "sign");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Modf:
	case GLSLstd450Frexp:
	{
		// Special case. If the variable is a scalar access chain, we cannot use it directly. We have to emit a temporary.
		auto *ptr = maybe_get<SPIRExpression>(args[1]);
		if (ptr && ptr->access_chain && is_scalar(expression_type(args[1])))
		{
			register_call_out_argument(args[1]);
			forced_temporaries.insert(id);

			// Need to create temporaries and copy over to access chain after.
			// We cannot directly take the reference of a vector swizzle in MSL, even if it's scalar ...
			uint32_t &tmp_id = extra_sub_expressions[id];
			if (!tmp_id)
				tmp_id = ir.increase_bound_by(1);

			uint32_t tmp_type_id = get_pointee_type_id(ptr->expression_type);
			emit_uninitialized_temporary_expression(tmp_type_id, tmp_id);
			emit_binary_func_op(result_type, id, args[0], tmp_id, eop == GLSLstd450Modf ? "modf" : "frexp");
			statement(to_expression(args[1]), " = ", to_expression(tmp_id), ";");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}